

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::CopyImage::InvalidAlignmentTest::iterate(InvalidAlignmentTest *this)

{
  ostringstream *this_00;
  GLenum GVar1;
  int iVar2;
  GLuint GVar3;
  GLenum GVar4;
  IterateResult IVar5;
  undefined4 extraout_var;
  MessageBuilder *pMVar6;
  uint uVar7;
  pointer value;
  GLuint temp;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  temp = 0;
  value = (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_start + this->m_test_case_index;
  GVar3 = Utils::prepareTex16x16x6
                    ((this->super_TestCase).m_context,0xde1,0x8dbd,0x8227,0x1401,&temp);
  this->m_dst_tex_name = GVar3;
  GVar3 = Utils::prepareTex16x16x6
                    ((this->super_TestCase).m_context,0xde1,0x8dbd,0x8227,0x1401,&temp);
  this->m_src_tex_name = GVar3;
  Utils::makeTextureComplete((this->super_TestCase).m_context,0xde1,this->m_dst_tex_name,0,0);
  Utils::makeTextureComplete((this->super_TestCase).m_context,0xde1,this->m_src_tex_name,0,0);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x310))
            (this->m_src_tex_name,0xde1,0,value->m_src_x,value->m_src_y,0,this->m_dst_tex_name,0xde1
             ,0,value->m_dst_x,value->m_dst_y,0,value->m_width,value->m_height,1);
  GVar4 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  GVar1 = value->m_expected_result;
  clean(this);
  if (GVar1 == GVar4) {
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    uVar7 = this->m_test_case_index + 1;
    this->m_test_case_index = uVar7;
    IVar5 = (IterateResult)
            ((ulong)uVar7 <
            (ulong)(((long)(this->m_test_cases).
                           super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_test_cases).
                          super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x1c));
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Failure. Expected result: ");
    local_1c0.m_value = value->m_expected_result;
    local_1c0.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::operator<<((ostream *)this_00," got: ");
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = GVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,". source: [");
    pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&value->m_src_x);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&value->m_src_y);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    "], destination: [");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&value->m_src_x);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&value->m_src_y);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"], size: ")
    ;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&value->m_width);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>," x ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&value->m_height);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
    IVar5 = STOP;
  }
  return IVar5;
}

Assistant:

tcu::TestNode::IterateResult InvalidAlignmentTest::iterate()
{
	GLenum						 error	 = GL_NO_ERROR;
	const Functions&			 gl		   = m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result = tcu::TestNode::STOP;
	bool						 result	= false;
	GLuint						 temp	  = 0;
	const testCase&				 test_case = m_test_cases[m_test_case_index];

	try
	{
		/* Prepare textures */
		m_dst_tex_name =
			Utils::prepareTex16x16x6(m_context, GL_TEXTURE_2D, GL_COMPRESSED_RG_RGTC2, GL_RG, GL_UNSIGNED_BYTE, temp);
		m_src_tex_name =
			Utils::prepareTex16x16x6(m_context, GL_TEXTURE_2D, GL_COMPRESSED_RG_RGTC2, GL_RG, GL_UNSIGNED_BYTE, temp);

		/* Make textures complete */
		Utils::makeTextureComplete(m_context, GL_TEXTURE_2D, m_dst_tex_name, 0 /* base */, 0 /* max */);
		Utils::makeTextureComplete(m_context, GL_TEXTURE_2D, m_src_tex_name, 0 /* base */, 0 /* max */);
	}
	catch (tcu::Exception& exc)
	{
		clean();
		throw exc;
	}

	/* Execute CopyImageSubData */
	gl.copyImageSubData(m_src_tex_name, GL_TEXTURE_2D, 0 /* level */, test_case.m_src_x /* srcX */,
						test_case.m_src_y /* srcY */, 0 /* srcZ */, m_dst_tex_name, GL_TEXTURE_2D, 0 /* level */,
						test_case.m_dst_x /* dstX */, test_case.m_dst_y /* dstY */, 0 /* dstZ */,
						test_case.m_width /* srcWidth */, test_case.m_height /* srcHeight */, 1 /* srcDepth */);

	/* Verify generated error */
	error  = gl.getError();
	result = (test_case.m_expected_result == error);

	/* Free resources */
	clean();

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Failure. Expected result: " << glu::getErrorStr(test_case.m_expected_result)
			<< " got: " << glu::getErrorStr(error) << ". source: [" << test_case.m_src_x << ", " << test_case.m_src_y
			<< "], destination: [" << test_case.m_src_x << ", " << test_case.m_src_y << "], size: " << test_case.m_width
			<< " x " << test_case.m_height << tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}